

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k051649.c
# Opt level: O1

void k051649_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  DEV_SMPL *__s;
  DEV_SMPL *__s_00;
  uint *puVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  
  __s = *outputs;
  __s_00 = outputs[1];
  uVar8 = (ulong)samples;
  lVar9 = 0;
  memset(__s,0,uVar8 * 4);
  memset(__s_00,0,uVar8 * 4);
  do {
    iVar2 = *(int *)((long)param + lVar9 * 0x2c + 0xc);
    if (((8 < iVar2) &&
        (puVar5 = (uint *)((long)param + lVar9 * 0x2c + 8), *(char *)((long)puVar5 + 0x2a) == '\0'))
       && (samples != 0)) {
      uVar3 = *(uint *)((long)param + 0xe4);
      iVar4 = *(int *)((long)param + 0xe8);
      cVar1 = *(char *)((long)puVar5 + 9);
      uVar6 = 0;
      do {
        uVar7 = *puVar5 + (int)(long)((float)((ulong)uVar3 << 0x10) /
                                      ((float)(uint)((iVar2 + 1) * iVar4) * 0.5) + 0.5);
        *puVar5 = uVar7;
        if (cVar1 != '\0') {
          __s[uVar6] = __s[uVar6] +
                       ((int)((uint)(byte)puVar5[2] *
                             (int)*(char *)((long)puVar5 + (ulong)(uVar7 >> 0x10 & 0x1f) + 10)) >> 4
                       );
        }
        uVar6 = uVar6 + 1;
      } while (uVar8 != uVar6);
    }
    lVar9 = lVar9 + 1;
  } while (lVar9 != 5);
  if (samples != 0) {
    uVar6 = 0;
    do {
      iVar2 = __s[uVar6];
      __s[uVar6] = iVar2 << 5;
      __s_00[uVar6] = iVar2 << 5;
      uVar6 = uVar6 + 1;
    } while (uVar8 != uVar6);
  }
  return;
}

Assistant:

static void k051649_update(void *param, UINT32 samples, DEV_SMPL **outputs)
{
	k051649_state *info = (k051649_state *)param;
	k051649_sound_channel *voice=info->channel_list;
	DEV_SMPL *buffer = outputs[0];
	DEV_SMPL *buffer2 = outputs[1];
	UINT32 i,j;

	// zap the contents of the mixer buffer
	memset(buffer, 0, samples * sizeof(DEV_SMPL));
	memset(buffer2, 0, samples * sizeof(DEV_SMPL));

	for (j = 0; j < 5; j++)
	{
		// channel is halted for freq < 9
		if (voice[j].frequency > 8 && ! voice[j].Muted)
		{
			UINT32 step = (UINT32)(((INT64)info->mclock * (1 << FREQ_BITS)) / (float)((voice[j].frequency + 1) * info->rate / 2.0f) + 0.5f);

			for (i = 0; i < samples; i++)
			{
				voice[j].counter += step;
				if (voice[j].key)
				{
					UINT32 offs = (voice[j].counter >> FREQ_BITS) & 0x1f;
					// 0x80 [wave] * 0x0F [volume] -> range +-0x780 per channel, 0x2580 total
					DEV_SMPL smpl = voice[j].waveram[offs] * voice[j].volume;
					// scale to 11 bit digital output on chip
					smpl >>= 4;	// results in [-600 .. +600]
					buffer[i] += smpl;
				}
			}
		}
	}
	for (i = 0; i < samples; i++)
	{
		// scale to +-0x7800 (fallback solution to keep volume intact)
		buffer[i] = buffer[i] * 256 / 8;
		buffer2[i] = buffer[i];
	}
}